

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleExposeEvent(QWidgetWindow *this,QExposeEvent *event)

{
  bool bVar1;
  byte bVar2;
  QWidgetPrivate *pQVar3;
  QWidget *pQVar4;
  ulong uVar5;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  QWidget *p;
  bool exposed;
  QWidgetPrivate *wPriv;
  QHideEvent hideEvent;
  QShowEvent showEvent;
  WidgetAttribute in_stack_ffffffffffffffa4;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6853);
  bVar1 = QWidget::testAttribute(in_RDI,in_stack_ffffffffffffffa4);
  if (!bVar1) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6879);
    pQVar3 = QWidget::d_func((QWidget *)0x3b6881);
    bVar2 = QWindow::isExposed();
    bVar2 = bVar2 & 1;
    if ((bVar2 == 0) || ((*(uint *)&(pQVar3->data).field_0x10 >> 0x12 & 1) == 0)) {
      if ((*(uint *)&pQVar3->field_0x250 >> 0x1d & 1) != 0) {
        bVar1 = SUB81((ulong)pQVar3 >> 0x38,0);
        if (bVar2 == 0) {
          if ((*(uint *)&pQVar3->field_0x250 >> 0x1e & 1) != 0) {
            QWidgetPrivate::hideChildren(in_RSI,bVar1);
            local_28 = &DAT_aaaaaaaaaaaaaaaa;
            local_20 = &DAT_aaaaaaaaaaaaaaaa;
            QHideEvent::QHideEvent((QHideEvent *)&local_28);
            pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b69c5);
            QCoreApplication::forwardEvent
                      (&pQVar4->super_QObject,(QEvent *)&local_28,(QEvent *)in_RSI);
            *(uint *)&pQVar3->field_0x250 = *(uint *)&pQVar3->field_0x250 & 0xbfffffff;
            QHideEvent::~QHideEvent((QHideEvent *)&local_28);
          }
        }
        else if ((*(uint *)&pQVar3->field_0x250 >> 0x1e & 1) == 0) {
          QWidgetPrivate::showChildren(in_RSI,bVar1);
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)&local_18);
          pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b6932);
          QCoreApplication::forwardEvent
                    (&pQVar4->super_QObject,(QEvent *)&local_18,(QEvent *)in_RSI);
          *(uint *)&pQVar3->field_0x250 = *(uint *)&pQVar3->field_0x250 & 0xbfffffff | 0x40000000;
          QShowEvent::~QShowEvent((QShowEvent *)&local_18);
        }
      }
      if (bVar2 == 0) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6acc);
        QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
      }
      else {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6a18);
        QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6a38);
        pQVar3 = (QWidgetPrivate *)QWidget::parentWidget((QWidget *)0x3b6a40);
        while( true ) {
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (pQVar3 != (QWidgetPrivate *)0x0) {
            bVar1 = QWidget::testAttribute(in_RDI,in_stack_ffffffffffffffa4);
            in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4) ^ 0xff000000
            ;
          }
          if ((in_stack_ffffffffffffffa4 & 0x1000000) == WA_Disabled) break;
          QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
          pQVar3 = (QWidgetPrivate *)QWidget::parentWidget((QWidget *)0x3b6a90);
        }
        uVar5 = QRegion::isNull();
        if ((uVar5 & 1) == 0) {
          QWidgetPrivate::syncBackingStore(pQVar3,(QRegion *)in_RDI);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleExposeEvent(QExposeEvent *event)
{
    if (m_widget->testAttribute(Qt::WA_DontShowOnScreen))
        return; // Ignore for widgets that fake exposure

    QWidgetPrivate *wPriv = m_widget->d_func();
    const bool exposed = isExposed();

    // We might get an expose event from the platform as part of
    // closing the window from ~QWidget, to support animated close
    // transitions. But at that point we no longer have a widget
    // subclass to draw a new frame, so skip the expose event.
    if (exposed && wPriv->data.in_destructor)
        return;

    if (wPriv->childrenHiddenByWState) {
        // If widgets has been previously hidden by window state change event
        // and they aren't yet shown...
        if (exposed) {
            // If the window becomes exposed...
            if (!wPriv->childrenShownByExpose) {
                // ... and they haven't been shown by this function yet - show it.
                wPriv->showChildren(true);
                QShowEvent showEvent;
                QCoreApplication::forwardEvent(m_widget, &showEvent, event);
                wPriv->childrenShownByExpose = true;
            }
        } else {
            // If the window becomes not exposed...
            if (wPriv->childrenShownByExpose) {
                // ... and child widgets was previously shown by the expose event - hide widgets again.
                // This is a workaround, because sometimes when window is minimized programmatically,
                // the QPA can notify that the window is exposed after changing window state to minimized
                // and then, the QPA can send next expose event with null exposed region (not exposed).
                wPriv->hideChildren(true);
                QHideEvent hideEvent;
                QCoreApplication::forwardEvent(m_widget, &hideEvent, event);
                wPriv->childrenShownByExpose = false;
            }
        }
    }

    if (exposed) {
        // QTBUG-39220, QTBUG-58575: set all (potentially fully obscured parent widgets) mapped.
        m_widget->setAttribute(Qt::WA_Mapped);
        for (QWidget *p = m_widget->parentWidget(); p && !p->testAttribute(Qt::WA_Mapped); p = p->parentWidget())
            p->setAttribute(Qt::WA_Mapped);
        if (!event->m_region.isNull())
            wPriv->syncBackingStore(event->m_region);
    } else {
        m_widget->setAttribute(Qt::WA_Mapped, false);
    }
}